

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib560.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint *puVar6;
  undefined8 uVar7;
  FILE *pFVar8;
  ulong uVar9;
  char *pcVar10;
  timeval tVar11;
  undefined8 uStack_1e0;
  int still_running;
  long local_1d0;
  int maxfd;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  
  tv_test_start = tutil_tvnow();
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    lVar4 = 0;
    fprintf(_stderr,"%s:%d curl_easy_init() failed\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
            ,0x36);
    uVar1 = 0x7c;
    goto LAB_00102781;
  }
  uVar1 = curl_easy_setopt(lVar3,0x2712,URL);
  pFVar8 = _stderr;
  if (uVar1 == 0) {
    uVar1 = curl_easy_setopt(lVar3,0x2a,1);
    pFVar8 = _stderr;
    if (uVar1 == 0) {
      uVar1 = curl_easy_setopt(lVar3,0x40,0);
      pFVar8 = _stderr;
      if (uVar1 == 0) {
        uVar1 = curl_easy_setopt(lVar3,0x51,0);
        pFVar8 = _stderr;
        if (uVar1 == 0) {
          lVar4 = curl_multi_init();
          if (lVar4 == 0) {
            lVar4 = 0;
            fprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                    ,0x3f);
            uVar1 = 0x7b;
            goto LAB_00102781;
          }
          uVar1 = curl_multi_add_handle(lVar4,lVar3);
          pFVar8 = _stderr;
          if (uVar1 == 0) {
            uVar1 = curl_multi_perform(lVar4,&still_running);
            pFVar8 = _stderr;
            if (uVar1 == 0) {
              if (still_running < 0) {
                fprintf(_stderr,
                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                        ,0x45);
                uVar1 = 0x7a;
              }
              else {
                tVar11 = tutil_tvnow();
                lVar5 = tutil_tvdiff(tVar11,tv_test_start);
                if (lVar5 < 0xea61) {
                  if (still_running == 0) {
                    uVar1 = 0;
                  }
                  else {
                    local_1d0 = lVar3;
                    do {
                      maxfd = -99;
                      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
                        fdread.__fds_bits[lVar3] = 0;
                      }
                      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
                        fdwrite.__fds_bits[lVar3] = 0;
                      }
                      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
                        fdexcep.__fds_bits[lVar3] = 0;
                      }
                      timeout.tv_sec = 1;
                      timeout.tv_usec = 0;
                      uVar1 = curl_multi_fdset(lVar4,&fdread,&fdwrite,&fdexcep,&maxfd);
                      pFVar8 = _stderr;
                      if (uVar1 != 0) {
                        uVar7 = curl_multi_strerror(uVar1);
                        pcVar10 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
                        uStack_1e0 = 0x5a;
LAB_0010271b:
                        fprintf(pFVar8,pcVar10,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                                ,uStack_1e0,(ulong)uVar1,uVar7);
                        lVar3 = local_1d0;
                        goto LAB_00102781;
                      }
                      if (maxfd < -1) {
                        pcVar10 = 
                        "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                        ;
                        uStack_1e0 = 0x5a;
LAB_00102748:
                        fprintf(_stderr,pcVar10,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                                ,uStack_1e0);
                        uVar1 = 0x7a;
                        lVar3 = local_1d0;
                        goto LAB_00102781;
                      }
                      iVar2 = select_wrapper(maxfd + 1,&fdread,&fdwrite,&fdexcep,&timeout);
                      if (iVar2 == -1) {
                        puVar6 = (uint *)__errno_location();
                        pFVar8 = _stderr;
                        uVar1 = *puVar6;
                        pcVar10 = strerror(uVar1);
                        fprintf(pFVar8,"%s:%d select() failed, with errno %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                                ,0x5e,(ulong)uVar1,pcVar10);
                        uVar1 = 0x79;
                        lVar3 = local_1d0;
                        goto LAB_00102781;
                      }
                      tVar11 = tutil_tvnow();
                      lVar3 = tutil_tvdiff(tVar11,tv_test_start);
                      if (60000 < lVar3) {
                        uStack_1e0 = 0x60;
LAB_0010276e:
                        fprintf(_stderr,
                                "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                                ,uStack_1e0);
                        uVar1 = 0x7d;
                        lVar3 = local_1d0;
                        goto LAB_00102781;
                      }
                      uVar1 = curl_multi_perform(lVar4,&still_running);
                      pFVar8 = _stderr;
                      if (uVar1 != 0) {
                        uVar7 = curl_multi_strerror(uVar1);
                        pcVar10 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
                        uStack_1e0 = 99;
                        goto LAB_0010271b;
                      }
                      if (still_running < 0) {
                        pcVar10 = 
                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                        ;
                        uStack_1e0 = 99;
                        goto LAB_00102748;
                      }
                      tVar11 = tutil_tvnow();
                      lVar3 = tutil_tvdiff(tVar11,tv_test_start);
                      if (60000 < lVar3) {
                        uStack_1e0 = 0x65;
                        goto LAB_0010276e;
                      }
                    } while (still_running != 0);
                    uVar1 = 0;
                    lVar3 = local_1d0;
                  }
                }
                else {
                  fprintf(_stderr,
                          "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                          ,0x47);
                  uVar1 = 0x7d;
                }
              }
              goto LAB_00102781;
            }
            uVar9 = (ulong)uVar1;
            uVar7 = curl_multi_strerror(uVar1);
            pcVar10 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
            uStack_1e0 = 0x45;
          }
          else {
            uVar9 = (ulong)uVar1;
            uVar7 = curl_multi_strerror(uVar1);
            pcVar10 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
            uStack_1e0 = 0x42;
          }
        }
        else {
          uVar9 = (ulong)uVar1;
          uVar7 = curl_easy_strerror(uVar1);
          pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          lVar4 = 0;
          uStack_1e0 = 0x3c;
        }
      }
      else {
        uVar9 = (ulong)uVar1;
        uVar7 = curl_easy_strerror(uVar1);
        pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar4 = 0;
        uStack_1e0 = 0x3b;
      }
    }
    else {
      uVar9 = (ulong)uVar1;
      uVar7 = curl_easy_strerror(uVar1);
      pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar4 = 0;
      uStack_1e0 = 0x3a;
    }
  }
  else {
    uVar9 = (ulong)uVar1;
    uVar7 = curl_easy_strerror(uVar1);
    pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
    lVar4 = 0;
    uStack_1e0 = 0x39;
  }
  uVar1 = (uint)uVar9;
  fprintf(pFVar8,pcVar10,
          "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
          ,uStack_1e0,uVar9,uVar7);
LAB_00102781:
  curl_multi_cleanup(lVar4);
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
  return uVar1;
}

Assistant:

int test(char *URL)
{
  CURL *http_handle = NULL;
  CURLM *multi_handle = NULL;
  int res = 0;

  int still_running; /* keep number of running handles */

  start_test_timing();

  /*
  ** curl_global_init called indirectly from curl_easy_init.
  */

  easy_init(http_handle);

  /* set options */
  easy_setopt(http_handle, CURLOPT_URL, URL);
  easy_setopt(http_handle, CURLOPT_HEADER, 1L);
  easy_setopt(http_handle, CURLOPT_SSL_VERIFYPEER, 0L);
  easy_setopt(http_handle, CURLOPT_SSL_VERIFYHOST, 0L);

  /* init a multi stack */
  multi_init(multi_handle);

  /* add the individual transfers */
  multi_add_handle(multi_handle, http_handle);

  /* we start some action by calling perform right away */
  multi_perform(multi_handle, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;

    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    /* set a suitable timeout to play around with */
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    /* get file descriptors from the transfers */
    multi_fdset(multi_handle, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    /* timeout or readable/writable sockets */
    multi_perform(multi_handle, &still_running);

    abort_on_test_timeout();
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi_handle);
  curl_easy_cleanup(http_handle);
  curl_global_cleanup();

  return res;
}